

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O2

void __thiscall
AnalyserExternalVariable_containsDependencyByPointer_Test::
~AnalyserExternalVariable_containsDependencyByPointer_Test
          (AnalyserExternalVariable_containsDependencyByPointer_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, containsDependencyByPointer)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));
    auto dependency = model->component("membrane")->variable("Cm");

    externalVariable->addDependency(dependency);

    EXPECT_TRUE(externalVariable->containsDependency(dependency));
    EXPECT_FALSE(externalVariable->containsDependency(nullptr));
}